

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTPNDstrBase::CTPNDstrBase(CTPNDstrBase *this,char *str,size_t len)

{
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_003085c0;
  this->str_ = str;
  this->len_ = len;
  CTcGenTarg::note_str(G_cg,len);
  return;
}

Assistant:

CTPNDstrBase::CTPNDstrBase(const char *str, size_t len)
{
    /* remember the string */
    str_ = str;
    len_ = len;

    /* 
     *   note the length in the parser, in case it's the longest string
     *   we've seen so far 
     */
    G_cg->note_str(len);
}